

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O1

void __thiscall Character::Defend(Character *this,int attackRoll)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = (*this->_vptr_Character[1])();
  iVar3 = attackRoll - (iVar3 + this->armor);
  if (0 < iVar3) {
    piVar1 = &this->currentStrengthPoints;
    iVar2 = *piVar1;
    *piVar1 = *piVar1 - iVar3;
    if (*piVar1 == 0 || SBORROW4(iVar2,iVar3) != *piVar1 < 0) {
      this->alive = false;
    }
  }
  return;
}

Assistant:

void Character::Defend(int attackRoll)
{
    int defendRoll = this->RollDefense();
    int damage = attackRoll - defendRoll - armor;

    //std::cout << "Defender rolls: " << defendRoll << std::endl;

    if(damage > 0)
    {
        currentStrengthPoints -= damage;

        if(currentStrengthPoints <= 0)
        {
            alive = false;
        }
    }

}